

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bms_header_table.cpp
# Opt level: O0

bool __thiscall BmsHeaderTable::Query(BmsHeaderTable *this,string *key,string *v)

{
  bool bVar1;
  BmsHeader local_48;
  string *local_28;
  string *v_local;
  string *key_local;
  BmsHeaderTable *this_local;
  
  local_28 = v;
  v_local = key;
  key_local = (string *)this;
  bVar1 = IsExists(this,key);
  if (bVar1) {
    operator[](this,v_local);
    BmsHeader::ToString_abi_cxx11_(&local_48);
    std::__cxx11::string::operator=((string *)local_28,(string *)&local_48);
    std::__cxx11::string::~string((string *)&local_48);
  }
  return bVar1;
}

Assistant:

bool
BmsHeaderTable::Query(const std::string& key, std::string& v)
{
	if (IsExists(key)) {
		v = this->operator[](key).ToString();
		return true;
	}
	return false;
}